

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_parse_ini_string(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_context *pCtx_00;
  int iVar1;
  char *zIn;
  int local_4c;
  sxu32 local_34;
  char *pcStack_30;
  int nByte;
  char *zIni;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  zIni = (char *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if ((0 < nArg) && (iVar1 = jx9_value_is_string(*apArg), iVar1 != 0)) {
    zIn = jx9_value_to_string(*(jx9_value **)zIni,(int *)&local_34);
    pCtx_00 = pjStack_18;
    pcStack_30 = zIn;
    if (apArg_local._4_4_ < 2) {
      local_4c = 0;
    }
    else {
      local_4c = jx9_value_to_bool(*(jx9_value **)(zIni + 8));
    }
    jx9ParseIniString(pCtx_00,zIn,local_34,local_4c);
    return 0;
  }
  jx9_result_bool(pjStack_18,0);
  return 0;
}

Assistant:

static int jx9Builtin_parse_ini_string(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zIni;
	int nByte;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE*/
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the raw INI buffer */
	zIni = jx9_value_to_string(apArg[0], &nByte);
	/* Process the INI buffer*/
	jx9ParseIniString(pCtx, zIni, (sxu32)nByte, (nArg > 1) ? jx9_value_to_bool(apArg[1]) : 0);
	return JX9_OK;
}